

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O0

bool ViewImage(string *path,Range range)

{
  int cyl_step;
  bool bVar1;
  int def_cyls;
  int def_heads;
  LogHelper *pLVar2;
  element_type *peVar3;
  anon_class_8_1_898aba9b local_68;
  function<void_(const_CylHead_&)> local_60;
  undefined1 local_30 [8];
  shared_ptr<Disk> disk;
  string *path_local;
  Range range_local;
  
  range_local._0_8_ = range._8_8_;
  path_local = range._0_8_;
  disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path;
  pLVar2 = util::operator<<((LogHelper *)&util::cout,(char (*) [2])0x2ab2a8);
  pLVar2 = util::operator<<(pLVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi);
  util::operator<<(pLVar2,(char (*) [3])"]\n");
  std::make_shared<Disk>();
  bVar1 = ReadImage((string *)
                    disk.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    (shared_ptr<Disk> *)local_30,true);
  cyl_step = opt.step;
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    def_cyls = Disk::cyls(peVar3);
    peVar3 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    def_heads = Disk::heads(peVar3);
    ValidateRange((Range *)&path_local,0x80,2,cyl_step,def_cyls,def_heads);
    local_68.disk = (shared_ptr<Disk> *)local_30;
    std::function<void(CylHead_const&)>::
    function<ViewImage(std::__cxx11::string_const&,Range)::__0,void>
              ((function<void(CylHead_const&)> *)&local_60,&local_68);
    Range::each((Range *)&path_local,&local_60,true);
    std::function<void_(const_CylHead_&)>::~function(&local_60);
  }
  std::shared_ptr<Disk>::~shared_ptr((shared_ptr<Disk> *)local_30);
  return true;
}

Assistant:

bool ViewImage(const std::string& path, Range range)
{
    util::cout << "[" << path << "]\n";

    auto disk = std::make_shared<Disk>();
    if (ReadImage(path, disk))
    {
        ValidateRange(range, MAX_TRACKS, MAX_SIDES, opt.step, disk->cyls(), disk->heads());

        range.each([&](const CylHead& cylhead) {
            auto track = disk->read_track(cylhead * opt.step);
            NormaliseTrack(cylhead, track);
            ViewTrack(cylhead, track);

            if (opt.verbose)
            {
                auto trackdata = disk->read(cylhead * opt.step);
                auto bitbuf = trackdata.preferred().bitstream();
                NormaliseBitstream(bitbuf);
                auto encoding = (opt.encoding == Encoding::Unknown) ?
                    bitbuf.encoding : opt.encoding;

                switch (encoding)
                {
                case Encoding::MFM:
                case Encoding::Amiga:
                case Encoding::Agat:
                case Encoding::MX:
                    ViewTrack_MFM_FM(Encoding::MFM, bitbuf);
                    break;
                case Encoding::FM:
                case Encoding::RX02:
                    ViewTrack_MFM_FM(Encoding::FM, bitbuf);
                    break;
                default:
                    throw util::exception("unsupported track view encoding");
                }
            }
            }, true);
    }

    return true;
}